

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O0

GLXFBConfig get_fbconfig_for_visinfo(Display *dpy,XVisualInfo *visinfo)

{
  int iVar1;
  int local_3c;
  long lStack_38;
  int v;
  GLXFBConfig *configs;
  GLXFBConfig ret;
  int nconfigs;
  int i;
  XVisualInfo *visinfo_local;
  Display *dpy_local;
  
  configs = (GLXFBConfig *)0x0;
  _nconfigs = visinfo;
  visinfo_local = (XVisualInfo *)dpy;
  lStack_38 = (*_epoxy_glXGetFBConfigs)(dpy,visinfo->screen,&ret);
  if (lStack_38 == 0) {
    dpy_local = (Display *)0x0;
  }
  else {
    for (ret._4_4_ = 0; ret._4_4_ < (int)ret; ret._4_4_ = ret._4_4_ + 1) {
      iVar1 = (*_epoxy_glXGetFBConfigAttrib)
                        (visinfo_local,*(undefined8 *)(lStack_38 + (long)ret._4_4_ * 8),0x800b,
                         &local_3c);
      if ((iVar1 == 0) && (local_3c == (int)_nconfigs->visualid)) {
        configs = *(GLXFBConfig **)(lStack_38 + (long)ret._4_4_ * 8);
        break;
      }
    }
    XFree(lStack_38);
    dpy_local = (Display *)configs;
  }
  return (GLXFBConfig)dpy_local;
}

Assistant:

GLXFBConfig
get_fbconfig_for_visinfo(Display *dpy, XVisualInfo *visinfo)
{
	int i, nconfigs;
	GLXFBConfig ret = None, *configs;

	configs = glXGetFBConfigs(dpy, visinfo->screen, &nconfigs);
	if (!configs)
		return None;

	for (i = 0; i < nconfigs; i++) {
		int v;

		if (glXGetFBConfigAttrib(dpy, configs[i], GLX_VISUAL_ID, &v))
			continue;

		if (v == (int)visinfo->visualid) {
			ret = configs[i];
			break;
		}
	}

	XFree(configs);
	return ret;
}